

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# llb1Matrix.c
# Opt level: O2

void Llb_MtrVerifyRowsAll(Llb_Mtr_t *p)

{
  int *piVar1;
  ulong uVar2;
  ulong uVar3;
  ulong uVar4;
  ulong uVar5;
  int iVar6;
  
  uVar3 = 0;
  uVar2 = (ulong)(uint)p->nCols;
  if (p->nCols < 1) {
    uVar2 = uVar3;
  }
  do {
    if (uVar3 == uVar2) {
      return;
    }
    uVar5 = 0;
    uVar4 = (ulong)(uint)p->nRows;
    if (p->nRows < 1) {
      uVar4 = uVar5;
    }
    iVar6 = 0;
    for (; uVar4 != uVar5; uVar5 = uVar5 + 1) {
      iVar6 = iVar6 + (uint)(p->pMatrix[uVar3][uVar5] == '\x01');
    }
    piVar1 = p->pColSums + uVar3;
    uVar3 = uVar3 + 1;
  } while (iVar6 == *piVar1);
  __assert_fail("Counter == p->pColSums[iCol]",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/bdd/llb/llb1Matrix.c"
                ,0x4c,"void Llb_MtrVerifyRowsAll(Llb_Mtr_t *)");
}

Assistant:

ABC_NAMESPACE_IMPL_START


////////////////////////////////////////////////////////////////////////
///                        DECLARATIONS                              ///
////////////////////////////////////////////////////////////////////////

//              0123              nCols
//             +--------------------->  
// pi        0 |  111             row0   pRowSums[0]  
// pi        1 | 1     11         row1   pRowSums[1] 
// pi        2 |   1  11          row2   pRowSums[2] 
// CS          |1       1
// CS          |1      111
// CS          |111    111
// int         |  11111           
// int         |     111          
// int         |       111        
// int         |         111      
// NS          |           11 11
// NS          |            11 1
// NS          |             111
//       nRows |
//             v    
//              cccc   pColSums[0]
//              oooo   pColSums[1]
//              llll   pColSums[2]
//              0123   pColSums[3]

////////////////////////////////////////////////////////////////////////
///                     FUNCTION DEFINITIONS                         ///
////////////////////////////////////////////////////////////////////////

/**Function*************************************************************

  Synopsis    [Verify columns.]

  Description []
               
  SideEffects []

  SeeAlso     []

***********************************************************************/
void Llb_MtrVerifyRowsAll( Llb_Mtr_t * p )
{
    int iRow, iCol, Counter;
    for ( iCol = 0; iCol < p->nCols; iCol++ )
    {
        Counter = 0;
        for ( iRow = 0; iRow < p->nRows; iRow++ )
            if ( p->pMatrix[iCol][iRow] == 1 )
                Counter++;
        assert( Counter == p->pColSums[iCol] );
    }
}